

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exceptions.h
# Opt level: O0

void __thiscall FIX::FieldConvertError::FieldConvertError(FieldConvertError *this,string *what)

{
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *what_local;
  FieldConvertError *this_local;
  
  local_18 = what;
  what_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Could not convert field",&local_39);
  Exception::Exception(&this->super_Exception,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  *(undefined ***)&this->super_Exception = &PTR__FieldConvertError_001b1348;
  return;
}

Assistant:

FieldConvertError( const std::string& what = "" )
    : Exception( "Could not convert field", what ) {}